

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

pair<const_int_*,_bool>
HighsHashTree<int,_void>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,HighsHashTableEntry<int,_void> *entry)

{
  int *piVar1;
  char *pcVar2;
  byte bVar3;
  pair<const_int_*,_bool> pVar4;
  uint uVar5;
  InnerLeaf<1> *this;
  ValueType *pVVar7;
  int iVar6;
  ulong *puVar8;
  undefined8 *puVar9;
  sbyte sVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint uVar11;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar12;
  undefined8 extraout_RDX_03;
  long lVar13;
  int i;
  long lVar14;
  ulong uVar15;
  array<HighsHashTableEntry<int,_void>,_54UL> *paVar16;
  int *piVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  undefined8 *puVar21;
  InnerLeaf<4> *this_00;
  BranchNode *branch;
  pair<const_int_*,_bool> pVar22;
  pair<const_int_*,_bool> pVar23;
  pair<const_int_*,_bool> pVar24;
  array<unsigned_char,_55UL> sizes;
  undefined8 local_70;
  byte local_68 [56];
  
  uVar15 = insertNode->ptrAndType;
  switch((uint)uVar15 & 7) {
  case 0:
    if (hashPos != 9) {
      this = (InnerLeaf<1> *)operator_new(0x60);
      (this->occupation).occupation = 0;
      this->size = 0;
      (this->hashes)._M_elems[0] = 0;
      insertNode->ptrAndType = (ulong)this | 2;
      pVar22 = InnerLeaf<1>::insert_entry(this,hash,hashPos,entry);
      return pVar22;
    }
    puVar9 = (undefined8 *)operator_new(0x18);
    *puVar9 = 0;
    piVar17 = (int *)(puVar9 + 1);
    *(int *)(puVar9 + 1) = entry->value_;
    *(undefined4 *)(puVar9 + 2) = 1;
    insertNode->ptrAndType = (ulong)puVar9 | 1;
    uVar12 = extraout_RDX;
    goto LAB_0027389e;
  case 1:
    iVar20 = entry->value_;
    puVar9 = (undefined8 *)(uVar15 & 0xfffffffffffffff8);
    do {
      puVar21 = puVar9;
      if (*(int *)(puVar21 + 1) == iVar20) {
        pVar4._8_8_ = 0;
        pVar4.first = (int *)(puVar21 + 1);
        return pVar4;
      }
      puVar9 = (undefined8 *)*puVar21;
    } while ((undefined8 *)*puVar21 != (undefined8 *)0x0);
    puVar9 = (undefined8 *)operator_new(0x10);
    *puVar9 = 0;
    piVar17 = (int *)(puVar9 + 1);
    *(int *)(puVar9 + 1) = iVar20;
    *puVar21 = puVar9;
    piVar1 = (int *)((undefined8 *)(uVar15 & 0xfffffffffffffff8) + 2);
    *piVar1 = *piVar1 + 1;
    uVar12 = extraout_RDX_00;
    goto LAB_0027389e;
  case 2:
    pVar23 = insert_into_leaf<1>(insertNode,(InnerLeaf<1> *)(uVar15 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 3:
    pVar23 = insert_into_leaf<2>(insertNode,(InnerLeaf<2> *)(uVar15 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 4:
    pVar23 = insert_into_leaf<3>(insertNode,(InnerLeaf<3> *)(uVar15 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar15 & 0xfffffffffffffff8);
    if (this_00->size < 0x36) {
      pVar22 = InnerLeaf<4>::insert_entry(this_00,hash,hashPos,entry);
      return pVar22;
    }
    pVVar7 = InnerLeaf<4>::find_entry(this_00,hash,hashPos,&entry->value_);
    if (pVVar7 != (ValueType *)0x0) {
      pVar22._8_8_ = 0;
      pVar22.first = pVVar7;
      return pVar22;
    }
    uVar5 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
    uVar15 = (this_00->occupation).occupation | 1L << (ulong)uVar5;
    lVar14 = POPCOUNT(uVar15);
    puVar8 = (ulong *)operator_new((lVar14 * 8 + 0x7fffffff8U & 0x7fffffff8) + 0x4f &
                                   0xffffffffffffffc0);
    insertNode->ptrAndType = (ulong)puVar8 | 6;
    *puVar8 = uVar15;
    iVar20 = hashPos + 1;
    uVar11 = (uint)lVar14;
    sVar10 = (sbyte)uVar5;
    if (iVar20 != 9) {
      if (uVar11 < 2) {
        insertNode = (NodePtr *)(puVar8 + 1);
        puVar8[1] = (ulong)this_00 | 5;
        InnerLeaf<4>::rehash(this_00,iVar20);
      }
      else {
        uVar5 = this_00->size;
        iVar6 = (uVar5 - uVar11) + 2;
        if (iVar6 < 7) {
          lVar13 = 0;
          local_70 = hash;
          do {
            puVar9 = (undefined8 *)operator_new(0x60);
            *puVar9 = 0;
            *(undefined4 *)(puVar9 + 1) = 0;
            puVar9[2] = 0;
            puVar8[lVar13 + 1] = (ulong)puVar9 | 2;
            lVar13 = lVar13 + 1;
          } while (lVar14 != lVar13);
          if (0 < (int)uVar5) {
            paVar16 = &this_00->entries;
            lVar14 = 0;
            do {
              uVar18 = (ulong)(uint)paVar16->_M_elems[0].value_;
              InnerLeaf<1>::insert_entry
                        ((InnerLeaf<1> *)
                         (puVar8[POPCOUNT(uVar15 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar14]
                                                           >> 10) & 0x3f))] & 0xfffffffffffffff8),
                         uVar18 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                         uVar18 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar20,paVar16->_M_elems)
              ;
              lVar14 = lVar14 + 1;
              paVar16 = (array<HighsHashTableEntry<int,_void>,_54UL> *)(paVar16->_M_elems + 1);
            } while (lVar14 < this_00->size);
          }
          operator_delete(this_00);
          hash = local_70;
          pVar24 = InnerLeaf<1>::insert_entry
                             ((InnerLeaf<1> *)
                              (puVar8[POPCOUNT(uVar15 >> sVar10)] & 0xfffffffffffffff8),local_70,
                              iVar20,entry);
          iVar20 = hashPos;
        }
        else {
          local_68[0x20] = 0;
          local_68[0x21] = 0;
          local_68[0x22] = 0;
          local_68[0x23] = 0;
          local_68[0x24] = 0;
          local_68[0x25] = 0;
          local_68[0x26] = 0;
          local_68[0x27] = 0;
          local_68[0x28] = 0;
          local_68[0x29] = 0;
          local_68[0x2a] = 0;
          local_68[0x2b] = 0;
          local_68[0x2c] = 0;
          local_68[0x2d] = 0;
          local_68[0x2e] = 0;
          local_68[0x10] = 0;
          local_68[0x11] = 0;
          local_68[0x12] = 0;
          local_68[0x13] = 0;
          local_68[0x14] = 0;
          local_68[0x15] = 0;
          local_68[0x16] = 0;
          local_68[0x17] = 0;
          local_68[0x18] = 0;
          local_68[0x19] = 0;
          local_68[0x1a] = 0;
          local_68[0x1b] = 0;
          local_68[0x1c] = 0;
          local_68[0x1d] = 0;
          local_68[0x1e] = 0;
          local_68[0x1f] = 0;
          local_68[0] = 0;
          local_68[1] = 0;
          local_68[2] = 0;
          local_68[3] = 0;
          local_68[4] = 0;
          local_68[5] = 0;
          local_68[6] = 0;
          local_68[7] = 0;
          local_68[8] = 0;
          local_68[9] = 0;
          local_68[10] = 0;
          local_68[0xb] = 0;
          local_68[0xc] = 0;
          local_68[0xd] = 0;
          local_68[0xe] = 0;
          local_68[0xf] = 0;
          local_68[0x2f] = 0;
          local_68[0x30] = 0;
          local_68[0x31] = 0;
          local_68[0x32] = 0;
          local_68[0x33] = 0;
          local_68[0x34] = 0;
          local_68[0x35] = 0;
          local_68[0x36] = 0;
          pcVar2 = (char *)((long)&local_70 + POPCOUNT(uVar15 >> sVar10) + 7);
          *pcVar2 = *pcVar2 + '\x01';
          if (0 < (int)uVar5) {
            uVar18 = 0;
            do {
              pcVar2 = (char *)((long)&local_70 +
                               POPCOUNT(uVar15 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar18]
                                                         >> 10) & 0x3f)) + 7);
              *pcVar2 = *pcVar2 + '\x01';
              uVar18 = uVar18 + 1;
            } while (uVar5 != uVar18);
          }
          piVar17 = (int *)0x0;
          do {
            switch(local_68[(long)piVar17] + 9 >> 4) {
            case 0:
              puVar9 = (undefined8 *)operator_new(0x60);
              uVar18 = 2;
              break;
            case 1:
              puVar9 = (undefined8 *)operator_new(0x120);
              uVar18 = 3;
              break;
            case 2:
              puVar9 = (undefined8 *)operator_new(0x1e0);
              uVar18 = 4;
              break;
            case 3:
              puVar9 = (undefined8 *)operator_new(0x2a0);
              uVar18 = 5;
              break;
            default:
              goto switchD_00273da5_default;
            }
            *puVar9 = 0;
            *(undefined4 *)(puVar9 + 1) = 0;
            puVar9[2] = 0;
            puVar8[(long)piVar17 + 1] = uVar18 | (ulong)puVar9;
switchD_00273da5_default:
            piVar17 = (int *)((long)piVar17 + 1);
          } while ((int *)(ulong)(uVar11 + (uVar11 == 0)) != piVar17);
          if (0 < (int)uVar5) {
            paVar16 = &this_00->entries;
            piVar17 = (int *)0x0;
            do {
              uVar18 = puVar8[POPCOUNT(uVar15 >> ((byte)((uint)(this_00->hashes)._M_elems
                                                               [(long)piVar17] >> 10) & 0x3f))];
              switch((uint)uVar18 & 7) {
              case 2:
                uVar19 = (ulong)(uint)paVar16->_M_elems[0].value_;
                InnerLeaf<1>::insert_entry
                          ((InnerLeaf<1> *)(uVar18 & 0xfffffffffffffff8),
                           uVar19 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                           uVar19 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar20,
                           paVar16->_M_elems);
                break;
              case 3:
                uVar19 = (ulong)(uint)paVar16->_M_elems[0].value_;
                InnerLeaf<2>::insert_entry
                          ((InnerLeaf<2> *)(uVar18 & 0xfffffffffffffff8),
                           uVar19 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                           uVar19 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar20,
                           paVar16->_M_elems);
                break;
              case 4:
                uVar19 = (ulong)(uint)paVar16->_M_elems[0].value_;
                InnerLeaf<3>::insert_entry
                          ((InnerLeaf<3> *)(uVar18 & 0xfffffffffffffff8),
                           uVar19 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                           uVar19 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar20,
                           paVar16->_M_elems);
                break;
              case 5:
                uVar19 = (ulong)(uint)paVar16->_M_elems[0].value_;
                InnerLeaf<4>::insert_entry
                          ((InnerLeaf<4> *)(uVar18 & 0xfffffffffffffff8),
                           uVar19 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                           uVar19 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar20,
                           paVar16->_M_elems);
              }
              piVar17 = (int *)((long)piVar17 + 1);
              paVar16 = (array<HighsHashTableEntry<int,_void>,_54UL> *)(paVar16->_M_elems + 1);
            } while ((long)piVar17 < (long)this_00->size);
          }
          operator_delete(this_00);
          pVar24._8_8_ = extraout_RDX_03;
          pVar24.first = piVar17;
          insertNode = (NodePtr *)(puVar8 + POPCOUNT(uVar15 >> sVar10));
        }
        if (iVar6 < 7) {
          return pVar24;
        }
      }
      goto LAB_002739a5;
    }
    memset(puVar8 + 1,0,(ulong)(uVar11 << 3));
    iVar20 = this_00->size;
    if (0 < iVar20) {
      lVar14 = 0;
      do {
        lVar13 = POPCOUNT(uVar15 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar14] >> 10) & 0x3f))
        ;
        if ((puVar8[lVar13] & 7) == 0) {
          puVar9 = (undefined8 *)operator_new(0x18);
          *puVar9 = 0;
          *(int *)(puVar9 + 1) = (this_00->entries)._M_elems[lVar14].value_;
          *(undefined4 *)(puVar9 + 2) = 1;
          puVar8[lVar13] = (ulong)puVar9 | 1;
        }
        else {
          puVar21 = (undefined8 *)(puVar8[lVar13] & 0xfffffffffffffff8);
          puVar9 = (undefined8 *)operator_new(0x10);
          uVar12 = puVar21[1];
          *puVar9 = *puVar21;
          puVar9[1] = uVar12;
          *puVar21 = puVar9;
          *(int *)(puVar21 + 1) = (this_00->entries)._M_elems[lVar14].value_;
          *(int *)(puVar21 + 2) = *(int *)(puVar21 + 2) + 1;
          iVar20 = this_00->size;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar20);
    }
    operator_delete(this_00);
    if ((puVar8[POPCOUNT(uVar15 >> sVar10)] & 7) == 0) {
      puVar9 = (undefined8 *)operator_new(0x18);
      *puVar9 = 0;
      *(int *)(puVar9 + 1) = entry->value_;
      *(undefined4 *)(puVar9 + 2) = 1;
      puVar8[POPCOUNT(uVar15 >> sVar10)] = (ulong)puVar9 | 1;
      uVar12 = extraout_RDX_02;
    }
    else {
      puVar9 = (undefined8 *)(puVar8[POPCOUNT(uVar15 >> sVar10)] & 0xfffffffffffffff8);
      puVar21 = (undefined8 *)operator_new(0x10);
      uVar12 = puVar9[1];
      *puVar21 = *puVar9;
      puVar21[1] = uVar12;
      *puVar9 = puVar21;
      *(int *)(puVar9 + 1) = entry->value_;
      *(int *)(puVar9 + 2) = *(int *)(puVar9 + 2) + 1;
      uVar12 = extraout_RDX_01;
    }
    piVar17 = (int *)(puVar9 + 1);
LAB_0027389e:
    pVar23._9_7_ = (int7)((ulong)uVar12 >> 8);
    pVar23.second = true;
    pVar23.first = piVar17;
    break;
  case 6:
    uVar18 = hash >> ((char)hashPos * -6 + 0x3aU & 0x3f);
    branch = (BranchNode *)(uVar15 & 0xfffffffffffffff8);
    uVar15 = (branch->occupation).occupation;
    bVar3 = (byte)uVar18;
    lVar14 = POPCOUNT(uVar15 >> (bVar3 & 0x3f));
    if ((uVar15 >> (uVar18 & 0x3f) & 1) == 0) {
      branch = addChildToBranchNode(branch,bVar3 & 0x3f,(int)lVar14);
      branch->child[lVar14].ptrAndType = 0;
      (branch->occupation).occupation = (branch->occupation).occupation | 1L << (bVar3 & 0x3f);
    }
    else {
      lVar14 = lVar14 + -1;
    }
    insertNode->ptrAndType = (ulong)branch | 6;
    iVar20 = hashPos + 1;
    insertNode = branch->child + lVar14;
    goto LAB_002739a5;
  case 7:
    iVar20 = hashPos;
LAB_002739a5:
    pVar23 = insert_recurse(insertNode,hash,iVar20,entry);
  }
  return pVar23;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }